

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_23de0c::PulsePlayback::reset(PulsePlayback *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  pa_stream_flags_t pVar4;
  int iVar5;
  int iVar6;
  ALuint AVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  char *device_name;
  ulong uVar12;
  backend_exception *this_00;
  pa_stream *ppVar13;
  undefined8 *puVar14;
  long in_RDI;
  ALuint buflen;
  ALuint perlen;
  double scale;
  ALuint frame_size;
  pa_channel_map chanmap;
  pa_stream_flags_t flags;
  pa_operation *op;
  unique_lock<std::mutex> plock;
  PulseMainloop *in_stack_fffffffffffffe58;
  pa_stream_flags_t pVar15;
  unique_lock<std::mutex> *in_stack_fffffffffffffe60;
  unique_lock<std::mutex> *plock_00;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffe6c;
  PulsePlayback *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  pa_channel_map *in_stack_fffffffffffffe98;
  ALCdevice *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffed8;
  pa_context *context;
  unique_lock<std::mutex> *plock_01;
  pa_sample_spec *spec;
  pa_channel_map *chanmap_00;
  BackendType type;
  undefined1 local_b8 [4];
  pa_stream_flags_t local_34;
  undefined8 local_30;
  
  PulseMainloop::getUniqueLock(in_stack_fffffffffffffe58);
  pVar15 = (pa_stream_flags_t)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  if (*(long *)(in_RDI + 0xb8) != 0) {
    (*(anonymous_namespace)::ppa_stream_set_state_callback)(*(undefined8 *)(in_RDI + 0xb8),0);
    (*(anonymous_namespace)::ppa_stream_set_moved_callback)(*(undefined8 *)(in_RDI + 0xb8),0);
    (*(anonymous_namespace)::ppa_stream_set_write_callback)(*(undefined8 *)(in_RDI + 0xb8),0);
    (*(anonymous_namespace)::ppa_stream_set_buffer_attr_callback)(*(undefined8 *)(in_RDI + 0xb8),0);
    (*(anonymous_namespace)::ppa_stream_disconnect)(*(undefined8 *)(in_RDI + 0xb8));
    (*(anonymous_namespace)::ppa_stream_unref)(*(undefined8 *)(in_RDI + 0xb8));
    *(undefined8 *)(in_RDI + 0xb8) = 0;
  }
  spec = *(pa_sample_spec **)(in_RDI + 0xc0);
  chanmap_00 = (anonymous_namespace)::ppa_context_get_sink_info_by_name;
  uVar11 = std::__cxx11::string::c_str();
  uVar11 = (*(code *)chanmap_00)(spec,uVar11,sinkInfoCallbackC,in_RDI);
  local_30 = uVar11;
  PulseMainloop::waitForOperation
            ((PulseMainloop *)in_stack_fffffffffffffe70,
             (pa_operation *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  type = (BackendType)uVar11;
  pVar4 = operator|(PA_STREAM_START_CORKED,PA_STREAM_INTERPOLATE_TIMING);
  pVar4 = operator|(pVar4,PA_STREAM_AUTO_TIMING_UPDATE);
  local_34 = operator|(pVar4,PA_STREAM_EARLY_REQUESTS);
  iVar5 = GetConfigValueBool(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  if (iVar5 == 0) {
    operator|=((pa_stream_flags_t *)in_stack_fffffffffffffe60,pVar15);
  }
  std::__cxx11::string::c_str();
  iVar5 = GetConfigValueBool(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  if (iVar5 != 0) {
    operator&=(&local_34,-0x4001);
    operator|=((pa_stream_flags_t *)in_stack_fffffffffffffe60,pVar15);
  }
  std::__cxx11::string::c_str();
  iVar6 = GetConfigValueBool(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  if ((iVar6 != 0) ||
     (bVar3 = al::bitfield<5ul>::get<0ul>((bitfield<5ul> *)(*(long *)(in_RDI + 8) + 0x48)), !bVar3))
  {
    operator|=((pa_stream_flags_t *)in_stack_fffffffffffffe60,pVar15);
  }
  context = (pa_context *)0x0;
  plock_01 = (unique_lock<std::mutex> *)0x0;
  _local_b8 = (mutex_type *)0x0;
  device_name = (char *)(ulong)*(byte *)(*(long *)(in_RDI + 8) + 0x18);
  switch(device_name) {
  case (char *)0x0:
    memcpy(local_b8,(anonymous_namespace)::MonoChanMap,0x84);
    break;
  case (char *)0x2:
    memcpy(local_b8,(anonymous_namespace)::QuadChanMap,0x84);
    break;
  case (char *)0x3:
    memcpy(local_b8,(anonymous_namespace)::X51ChanMap,0x84);
    break;
  case (char *)0x4:
    memcpy(local_b8,(anonymous_namespace)::X61ChanMap,0x84);
    break;
  case (char *)0x5:
    memcpy(local_b8,(anonymous_namespace)::X71ChanMap,0x84);
    break;
  case (char *)0x6:
    *(undefined1 *)(*(long *)(in_RDI + 8) + 0x18) = 1;
  case (char *)0x1:
    memcpy(local_b8,(anonymous_namespace)::StereoChanMap,0x84);
    break;
  case (char *)0x7:
    memcpy(local_b8,(anonymous_namespace)::X51RearChanMap,0x84);
  }
  SetChannelOrderFromMap(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  uVar12 = (ulong)*(byte *)(*(long *)(in_RDI + 8) + 0x19);
  switch(uVar12) {
  case 0:
    *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 1;
  case 1:
    *(undefined4 *)(in_RDI + 0xac) = 0;
    break;
  case 3:
    *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 2;
  case 2:
    *(undefined4 *)(in_RDI + 0xac) = 3;
    break;
  case 5:
    *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 4;
  case 4:
    *(undefined4 *)(in_RDI + 0xac) = 7;
    break;
  case 6:
    *(undefined4 *)(in_RDI + 0xac) = 5;
  }
  *(undefined4 *)(in_RDI + 0xb0) = *(undefined4 *)(*(long *)(in_RDI + 8) + 0xc);
  AVar7 = ALCdevice::channelsFromFmt((ALCdevice *)0x2451ec);
  pVar15 = (pa_stream_flags_t)(uVar12 >> 0x20);
  *(char *)(in_RDI + 0xb4) = (char)AVar7;
  iVar8 = (*(anonymous_namespace)::ppa_sample_spec_valid)(in_RDI + 0xac);
  if (iVar8 != 0) {
    iVar9 = (*(anonymous_namespace)::ppa_frame_size)(in_RDI + 0xac);
    *(undefined4 *)(in_RDI + 0x98) = 0xffffffff;
    *(int *)(in_RDI + 0x9c) = *(int *)(*(long *)(in_RDI + 8) + 0x14) * iVar9;
    *(undefined4 *)(in_RDI + 0xa0) = 0;
    *(int *)(in_RDI + 0xa4) = *(int *)(*(long *)(in_RDI + 8) + 0x10) * iVar9;
    *(undefined4 *)(in_RDI + 0xa8) = 0xffffffff;
    std::__cxx11::string::c_str();
    plock_00 = (unique_lock<std::mutex> *)local_b8;
    uVar16 = 0;
    ppVar13 = PulseMainloop::connectStream
                        ((PulseMainloop *)CONCAT44(iVar5,iVar6),device_name,plock_01,context,pVar15,
                         (pa_buffer_attr *)CONCAT44(iVar8,in_stack_fffffffffffffed8),spec,chanmap_00
                         ,type);
    *(pa_stream **)(in_RDI + 0xb8) = ppVar13;
    (*(anonymous_namespace)::ppa_stream_set_state_callback)
              (*(undefined8 *)(in_RDI + 0xb8),streamStateCallbackC);
    (*(anonymous_namespace)::ppa_stream_set_moved_callback)
              (*(undefined8 *)(in_RDI + 0xb8),streamMovedCallbackC);
    puVar14 = (undefined8 *)
              (*(anonymous_namespace)::ppa_stream_get_sample_spec)(*(undefined8 *)(in_RDI + 0xb8));
    *(undefined4 *)(in_RDI + 0xb4) = *(undefined4 *)(puVar14 + 1);
    *(undefined8 *)(in_RDI + 0xac) = *puVar14;
    uVar10 = (*(anonymous_namespace)::ppa_frame_size)(in_RDI + 0xac);
    *(undefined4 *)(in_RDI + 200) = uVar10;
    if (*(int *)(*(long *)(in_RDI + 8) + 0xc) != *(int *)(in_RDI + 0xb0)) {
      dVar1 = clampd((double)in_stack_fffffffffffffe70,
                     (double)CONCAT44(in_stack_fffffffffffffe6c,uVar16),(double)plock_00);
      std::numeric_limits<int>::max();
      dVar2 = clampd((double)in_stack_fffffffffffffe70,
                     (double)CONCAT44(in_stack_fffffffffffffe6c,uVar16),(double)plock_00);
      *(undefined4 *)(in_RDI + 0x98) = 0xffffffff;
      *(int *)(in_RDI + 0x9c) = (int)(long)dVar2 * *(int *)(in_RDI + 200);
      *(undefined4 *)(in_RDI + 0xa0) = 0;
      *(int *)(in_RDI + 0xa4) = (int)(long)dVar1 * *(int *)(in_RDI + 200);
      local_30 = (*(anonymous_namespace)::ppa_stream_set_buffer_attr)
                           (*(undefined8 *)(in_RDI + 0xb8),in_RDI + 0x98,
                            PulseMainloop::streamSuccessCallbackC,in_RDI + 0x10);
      PulseMainloop::waitForOperation
                ((PulseMainloop *)in_stack_fffffffffffffe70,
                 (pa_operation *)CONCAT44(in_stack_fffffffffffffe6c,uVar16),plock_00);
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0xc) = *(undefined4 *)(in_RDI + 0xb0);
    }
    (*(anonymous_namespace)::ppa_stream_set_buffer_attr_callback)
              (*(undefined8 *)(in_RDI + 0xb8),bufferAttrCallbackC);
    bufferAttrCallback(in_stack_fffffffffffffe70,
                       (pa_stream *)CONCAT44(in_stack_fffffffffffffe6c,uVar16));
    *(uint *)(*(long *)(in_RDI + 8) + 0x14) = *(uint *)(in_RDI + 0x9c) / *(uint *)(in_RDI + 200);
    *(uint *)(*(long *)(in_RDI + 8) + 0x10) = *(uint *)(in_RDI + 0xa4) / *(uint *)(in_RDI + 200);
    std::unique_lock<std::mutex>::~unique_lock(plock_00);
    return true;
  }
  this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(this_00,0xa004,"Invalid sample spec");
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

bool PulsePlayback::reset()
{
    auto plock = mMainloop.getUniqueLock();

    if(mStream)
    {
        pa_stream_set_state_callback(mStream, nullptr, nullptr);
        pa_stream_set_moved_callback(mStream, nullptr, nullptr);
        pa_stream_set_write_callback(mStream, nullptr, nullptr);
        pa_stream_set_buffer_attr_callback(mStream, nullptr, nullptr);
        pa_stream_disconnect(mStream);
        pa_stream_unref(mStream);
        mStream = nullptr;
    }

    pa_operation *op{pa_context_get_sink_info_by_name(mContext, mDeviceName.c_str(),
        &PulsePlayback::sinkInfoCallbackC, this)};
    mMainloop.waitForOperation(op, plock);

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_INTERPOLATE_TIMING |
        PA_STREAM_AUTO_TIMING_UPDATE | PA_STREAM_EARLY_REQUESTS};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;
    if(GetConfigValueBool(mDevice->DeviceName.c_str(), "pulse", "adjust-latency", 0))
    {
        /* ADJUST_LATENCY can't be specified with EARLY_REQUESTS, for some
         * reason. So if the user wants to adjust the overall device latency,
         * we can't ask to get write signals as soon as minreq is reached.
         */
        flags &= ~PA_STREAM_EARLY_REQUESTS;
        flags |= PA_STREAM_ADJUST_LATENCY;
    }
    if(GetConfigValueBool(mDevice->DeviceName.c_str(), "pulse", "fix-rate", 0) ||
       !mDevice->Flags.get<FrequencyRequest>())
        flags |= PA_STREAM_FIX_RATE;

    pa_channel_map chanmap{};
    switch(mDevice->FmtChans)
    {
    case DevFmtMono:
        chanmap = MonoChanMap;
        break;
    case DevFmtAmbi3D:
        mDevice->FmtChans = DevFmtStereo;
        /*fall-through*/
    case DevFmtStereo:
        chanmap = StereoChanMap;
        break;
    case DevFmtQuad:
        chanmap = QuadChanMap;
        break;
    case DevFmtX51:
        chanmap = X51ChanMap;
        break;
    case DevFmtX51Rear:
        chanmap = X51RearChanMap;
        break;
    case DevFmtX61:
        chanmap = X61ChanMap;
        break;
    case DevFmtX71:
        chanmap = X71ChanMap;
        break;
    }
    SetChannelOrderFromMap(mDevice, chanmap);

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        mDevice->FmtType = DevFmtUByte;
        /* fall-through */
    case DevFmtUByte:
        mSpec.format = PA_SAMPLE_U8;
        break;
    case DevFmtUShort:
        mDevice->FmtType = DevFmtShort;
        /* fall-through */
    case DevFmtShort:
        mSpec.format = PA_SAMPLE_S16NE;
        break;
    case DevFmtUInt:
        mDevice->FmtType = DevFmtInt;
        /* fall-through */
    case DevFmtInt:
        mSpec.format = PA_SAMPLE_S32NE;
        break;
    case DevFmtFloat:
        mSpec.format = PA_SAMPLE_FLOAT32NE;
        break;
    }
    mSpec.rate = mDevice->Frequency;
    mSpec.channels = static_cast<uint8_t>(mDevice->channelsFromFmt());
    if(pa_sample_spec_valid(&mSpec) == 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Invalid sample spec"};

    const ALuint frame_size{static_cast<ALuint>(pa_frame_size(&mSpec))};
    mAttr.maxlength = ~0u;
    mAttr.tlength = mDevice->BufferSize * frame_size;
    mAttr.prebuf = 0u;
    mAttr.minreq = mDevice->UpdateSize * frame_size;
    mAttr.fragsize = ~0u;

    mStream = mMainloop.connectStream(mDeviceName.c_str(), plock, mContext, flags, &mAttr, &mSpec,
        &chanmap, BackendType::Playback);

    pa_stream_set_state_callback(mStream, &PulsePlayback::streamStateCallbackC, this);
    pa_stream_set_moved_callback(mStream, &PulsePlayback::streamMovedCallbackC, this);

    mSpec = *(pa_stream_get_sample_spec(mStream));
    mFrameSize = static_cast<ALuint>(pa_frame_size(&mSpec));

    if(mDevice->Frequency != mSpec.rate)
    {
        /* Server updated our playback rate, so modify the buffer attribs
         * accordingly.
         */
        const auto scale = static_cast<double>(mSpec.rate) / mDevice->Frequency;
        const ALuint perlen{static_cast<ALuint>(clampd(scale*mDevice->UpdateSize + 0.5, 64.0,
            8192.0))};
        const ALuint buflen{static_cast<ALuint>(clampd(scale*mDevice->BufferSize + 0.5, perlen*2,
            std::numeric_limits<int>::max()/mFrameSize))};

        mAttr.maxlength = ~0u;
        mAttr.tlength = buflen * mFrameSize;
        mAttr.prebuf = 0u;
        mAttr.minreq = perlen * mFrameSize;

        op = pa_stream_set_buffer_attr(mStream, &mAttr, &PulseMainloop::streamSuccessCallbackC,
            &mMainloop);
        mMainloop.waitForOperation(op, plock);

        mDevice->Frequency = mSpec.rate;
    }

    pa_stream_set_buffer_attr_callback(mStream, &PulsePlayback::bufferAttrCallbackC, this);
    bufferAttrCallback(mStream);

    mDevice->BufferSize = mAttr.tlength / mFrameSize;
    mDevice->UpdateSize = mAttr.minreq / mFrameSize;

    return true;
}